

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim2.c
# Opt level: O0

int Gia_ManSimSimulateEquiv(Gia_Man_t *pAig,Gia_ParSim_t *pPars)

{
  long lVar1;
  long lVar2;
  long lVar3;
  Gia_Man_t *p_00;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  Gia_Obj_t *p_01;
  int iVar10;
  int iVar11;
  uint uVar12;
  abctime aVar13;
  uint *pInfo;
  Abc_Cex_t *pAVar14;
  bool bVar15;
  long local_50;
  abctime nTimeToStop;
  int iPat;
  int iOut;
  int RetValue;
  int i;
  abctime clkTotal;
  Gia_Obj_t *pObj;
  Gia_Sim2_t *p;
  Gia_ParSim_t *pPars_local;
  Gia_Man_t *pAig_local;
  
  p = (Gia_Sim2_t *)pPars;
  pPars_local = (Gia_ParSim_t *)pAig;
  _RetValue = Abc_Clock();
  iPat = 0;
  if (*(int *)((long)&p->pPars + 4) == 0) {
    local_50 = 0;
  }
  else {
    iVar11 = *(int *)((long)&p->pPars + 4);
    aVar13 = Abc_Clock();
    local_50 = (long)iVar11 * 1000000 + aVar13;
  }
  lVar1._0_4_ = pPars_local[5].TimeLimit;
  lVar1._4_4_ = pPars_local[5].fCheckMiter;
  if ((lVar1 == 0) ||
     (lVar2._0_4_ = pPars_local[5].fVerbose, lVar2._4_4_ = pPars_local[5].iOutFail, lVar2 == 0)) {
    __assert_fail("pAig->pReprs && pAig->pNexts",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSim2.c"
                  ,0x285,"int Gia_ManSimSimulateEquiv(Gia_Man_t *, Gia_ParSim_t *)");
  }
  lVar3._0_4_ = pPars_local[0xc].nWords;
  lVar3._4_4_ = pPars_local[0xc].nIters;
  if (lVar3 != 0) {
    free(*(void **)(pPars_local + 0xc));
    pPars_local[0xc].nWords = 0;
    pPars_local[0xc].nIters = 0;
  }
  pObj = (Gia_Obj_t *)Gia_Sim2Create((Gia_Man_t *)pPars_local,(Gia_ParSim_t *)p);
  Gia_ManResetRandom((Gia_ParSim_t *)p);
  iOut = 0;
  while( true ) {
    iVar11 = iOut;
    iVar10 = Gia_ManRegNum(*(Gia_Man_t **)pObj);
    bVar15 = false;
    if (iVar11 < iVar10) {
      p_00 = *(Gia_Man_t **)pObj;
      iVar11 = Gia_ManPiNum(*(Gia_Man_t **)pObj);
      clkTotal = (abctime)Gia_ManCi(p_00,iVar11 + iOut);
      bVar15 = (Gia_Obj_t *)clkTotal != (Gia_Obj_t *)0x0;
    }
    p_01 = pObj;
    if (!bVar15) break;
    iVar11 = Gia_ObjValue((Gia_Obj_t *)clkTotal);
    pInfo = Gia_Sim2Data((Gia_Sim2_t *)p_01,iVar11);
    Gia_Sim2InfoZero((Gia_Sim2_t *)p_01,pInfo);
    iOut = iOut + 1;
  }
  iOut = 0;
  do {
    if (*(int *)((long)&p->pAig + 4) <= iOut) {
LAB_009d1099:
      Gia_Sim2Delete((Gia_Sim2_t *)pObj);
      lVar9._0_4_ = pPars_local[0xc].nWords;
      lVar9._4_4_ = pPars_local[0xc].nIters;
      if (lVar9 == 0) {
        Abc_Print(1,"No bug detected after simulating %d frames with %d words.  ",(ulong)(uint)iOut,
                  (ulong)*(uint *)&p->pAig);
      }
      aVar13 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar13 - _RetValue);
      return iPat;
    }
    Gia_Sim2SimulateRound((Gia_Sim2_t *)pObj);
    if (*(int *)&p->field_0x14 != 0) {
      Abc_Print(1,"Frame %4d out of %4d and timeout %3d sec. ",(ulong)(iOut + 1),
                (ulong)*(uint *)((long)&p->pAig + 4),(ulong)*(uint *)((long)&p->pPars + 4));
      lVar4._0_4_ = pPars_local[5].TimeLimit;
      lVar4._4_4_ = pPars_local[5].fCheckMiter;
      if ((lVar4 != 0) &&
         (lVar5._0_4_ = pPars_local[5].fVerbose, lVar5._4_4_ = pPars_local[5].iOutFail, lVar5 != 0))
      {
        uVar12 = Gia_ManEquivCountLitsAll((Gia_Man_t *)pPars_local);
        Abc_Print(1,"Lits = %4d. ",(ulong)uVar12);
      }
      aVar13 = Abc_Clock();
      Abc_Print(1,"Time = %7.2f sec\r",((double)aVar13 + -(double)_RetValue) / 1000000.0);
    }
    if ((p->nWords != 0) &&
       (iVar11 = Gia_Sim2CheckPos((Gia_Sim2_t *)pObj,(int *)((long)&nTimeToStop + 4),
                                  (int *)&nTimeToStop), iVar11 != 0)) {
      Gia_ManResetRandom((Gia_ParSim_t *)p);
      *(uint *)&p->pDataSim = nTimeToStop._4_4_;
      pAVar14 = Gia_Sim2GenerateCounter
                          ((Gia_Man_t *)pPars_local,iOut,nTimeToStop._4_4_,
                           *(int *)&pObj[1].field_0x4,(int)nTimeToStop);
      *(Abc_Cex_t **)(pPars_local + 0xc) = pAVar14;
      uVar6._0_4_ = pPars_local->nWords;
      uVar6._4_4_ = pPars_local->nIters;
      Abc_Print(1,"Output %d of miter \"%s\" was asserted in frame %d.  ",(ulong)nTimeToStop._4_4_,
                uVar6,(ulong)(uint)iOut);
      iVar11 = Gia_ManVerifyCex((Gia_Man_t *)pPars_local,*(Abc_Cex_t **)(pPars_local + 0xc),0);
      if (iVar11 == 0) {
        Abc_Print(1,"\nGenerated counter-example is INVALID.                    ");
      }
      iPat = 1;
      goto LAB_009d1099;
    }
    lVar7._0_4_ = pPars_local[5].TimeLimit;
    lVar7._4_4_ = pPars_local[5].fCheckMiter;
    if ((lVar7 != 0) &&
       (lVar8._0_4_ = pPars_local[5].fVerbose, lVar8._4_4_ = pPars_local[5].iOutFail, lVar8 != 0)) {
      Gia_Sim2InfoRefineEquivs((Gia_Sim2_t *)pObj);
    }
    aVar13 = Abc_Clock();
    if (local_50 < aVar13) {
      iOut = iOut + 1;
      goto LAB_009d1099;
    }
    if (iOut < *(int *)((long)&p->pAig + 4) + -1) {
      Gia_Sim2InfoTransfer((Gia_Sim2_t *)pObj);
    }
    iOut = iOut + 1;
  } while( true );
}

Assistant:

int Gia_ManSimSimulateEquiv( Gia_Man_t * pAig, Gia_ParSim_t * pPars )
{
    Gia_Sim2_t * p;
    Gia_Obj_t * pObj;
    abctime clkTotal = Abc_Clock();
    int i, RetValue = 0, iOut, iPat;
    abctime nTimeToStop = pPars->TimeLimit ? pPars->TimeLimit * CLOCKS_PER_SEC + Abc_Clock(): 0;
    assert( pAig->pReprs && pAig->pNexts );
    ABC_FREE( pAig->pCexSeq );
    p = Gia_Sim2Create( pAig, pPars );
    Gia_ManResetRandom( pPars );
    Gia_ManForEachRo( p->pAig, pObj, i )
        Gia_Sim2InfoZero( p, Gia_Sim2Data(p, Gia_ObjValue(pObj)) );
    for ( i = 0; i < pPars->nIters; i++ )
    {
        Gia_Sim2SimulateRound( p );
        if ( pPars->fVerbose )
        {
            Abc_Print( 1, "Frame %4d out of %4d and timeout %3d sec. ", i+1, pPars->nIters, pPars->TimeLimit );
            if ( pAig->pReprs && pAig->pNexts )
                Abc_Print( 1, "Lits = %4d. ", Gia_ManEquivCountLitsAll(pAig) );
            Abc_Print( 1, "Time = %7.2f sec\r", (1.0*Abc_Clock()-clkTotal)/CLOCKS_PER_SEC );
        }
        if ( pPars->fCheckMiter && Gia_Sim2CheckPos( p, &iOut, &iPat ) )
        {
            Gia_ManResetRandom( pPars );
            pPars->iOutFail = iOut;
            pAig->pCexSeq = Gia_Sim2GenerateCounter( pAig, i, iOut, p->nWords, iPat );
            Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d.  ", iOut, pAig->pName, i );
            if ( !Gia_ManVerifyCex( pAig, pAig->pCexSeq, 0 ) )
            {
//                Abc_Print( 1, "\n" );
                Abc_Print( 1, "\nGenerated counter-example is INVALID.                    " );
//                Abc_Print( 1, "\n" );
            }
            else
            {
//                Abc_Print( 1, "\n" );
//                if ( pPars->fVerbose )
//                Abc_Print( 1, "\nGenerated counter-example is verified correctly.         " );
//                Abc_Print( 1, "\n" );
            }
            RetValue = 1;
            break;
        }
        if ( pAig->pReprs && pAig->pNexts )
            Gia_Sim2InfoRefineEquivs( p );
        if ( Abc_Clock() > nTimeToStop )
        {
            i++;
            break;
        }
        if ( i < pPars->nIters - 1 )
            Gia_Sim2InfoTransfer( p );
    }
    Gia_Sim2Delete( p );
    if ( pAig->pCexSeq == NULL )
        Abc_Print( 1, "No bug detected after simulating %d frames with %d words.  ", i, pPars->nWords );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
    return RetValue;
}